

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O0

void __thiscall IfNeuron::prepareNextState(IfNeuron *this)

{
  bool bVar1;
  EVP_PKEY_CTX *in_RSI;
  double dVar2;
  IfNeuron *this_local;
  
  DifferentialEquation::prepareNextState(&this->ifneuronMembrane);
  bVar1 = StochasticProcess::isNextStatePrepared((StochasticProcess *)&this->ifneuronMembrane);
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.stochNextStateIsPrepared = bVar1;
  dVar2 = StochasticProcess::getNextValue((StochasticProcess *)&this->ifneuronMembrane);
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.stochNextValue = dVar2;
  if (((this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
       super_StochasticProcess.stochNextStateIsPrepared & 1U) != 0) {
    if (((this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue & 1U) == 0) {
      dVar2 = (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
              super_StochasticProcess.stochNextValue;
      if (this->ifneuronTheta <= dVar2 && dVar2 != this->ifneuronTheta) {
        (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
        super_StochasticProcess.stochNextValue = this->ifneuronSpikeHeight;
        (this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue = true;
      }
    }
    else {
      DifferentialEquation::init(&this->ifneuronMembrane,in_RSI);
      dVar2 = StochasticProcess::getNextValue((StochasticProcess *)&this->ifneuronMembrane);
      (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
      super_StochasticProcess.stochNextValue = dVar2;
      (this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue = false;
    }
  }
  return;
}

Assistant:

void IfNeuron::prepareNextState()
{
	// create next value of differential equation
	ifneuronMembrane.prepareNextState();
	stochNextStateIsPrepared = ifneuronMembrane.isNextStatePrepared();
	stochNextValue = ifneuronMembrane.getNextValue();
	
	// proceed if calculation was successful
	if (stochNextStateIsPrepared) {
		if (eventNextValue) {
			ifneuronMembrane.init();
			stochNextValue = ifneuronMembrane.getNextValue();
			eventNextValue = false;
		} else {
			if (stochNextValue>ifneuronTheta) {
				stochNextValue = ifneuronSpikeHeight;
				eventNextValue = true;
			}
		}
	}
}